

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_UInt FT_Get_Name_Index(FT_Face face,FT_String *glyph_name)

{
  FT_Driver pFVar1;
  FT_Module local_48;
  FT_Module local_40;
  FT_Pointer _tmp_;
  FT_Module module;
  FT_Pointer svc;
  FT_Service_GlyphDict service;
  FT_UInt result;
  FT_String *glyph_name_local;
  FT_Face face_local;
  
  service._4_4_ = 0;
  if (((face != (FT_Face)0x0) && ((face->face_flags & 0x200U) != 0)) &&
     (glyph_name != (FT_String *)0x0)) {
    module = (FT_Module)(face->internal->services).service_GLYPH_DICT;
    if (module == (FT_Module)0xfffffffffffffffe) {
      module = (FT_Module)0x0;
    }
    else if (module == (FT_Module)0x0) {
      pFVar1 = face->driver;
      local_40 = (FT_Module)0x0;
      if (((pFVar1->root).clazz)->get_interface != (FT_Module_Requester)0x0) {
        local_40 = (FT_Module)(*((pFVar1->root).clazz)->get_interface)(&pFVar1->root,"glyph-dict");
      }
      module = local_40;
      if (local_40 == (FT_Module)0x0) {
        local_48 = (FT_Module)0xfffffffffffffffe;
      }
      else {
        local_48 = local_40;
      }
      (face->internal->services).service_GLYPH_DICT = local_48;
    }
    if ((module != (FT_Module)0x0) && (module->library != (FT_Library)0x0)) {
      service._4_4_ = (*(code *)module->library)(face,glyph_name);
    }
  }
  return service._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_UInt )
  FT_Get_Name_Index( FT_Face           face,
                     const FT_String*  glyph_name )
  {
    FT_UInt  result = 0;


    if ( face                       &&
         FT_HAS_GLYPH_NAMES( face ) &&
         glyph_name                 )
    {
      FT_Service_GlyphDict  service;


      FT_FACE_LOOKUP_SERVICE( face,
                              service,
                              GLYPH_DICT );

      if ( service && service->name_index )
        result = service->name_index( face, glyph_name );
    }

    return result;
  }